

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

void JSON::writeDictionaryItem(Pipeline *p,bool *first,string *key,JSON *value,size_t depth)

{
  element_type *peVar1;
  __uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_> _Var2;
  
  writeDictionaryKey(p,first,key,depth);
  peVar1 = (value->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    _Var2._M_t.super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
    super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl =
         (peVar1->value)._M_t.
         super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>._M_t;
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>
                          .super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl + 0x10))
              (_Var2._M_t.
               super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
               super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl,p,depth);
    return;
  }
  Pipeline::operator<<(p,"null");
  return;
}

Assistant:

void
JSON::writeDictionaryItem(
    Pipeline* p, bool& first, std::string const& key, JSON const& value, size_t depth)
{
    writeDictionaryKey(p, first, key, depth);
    value.write(p, depth);
}